

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Underwater_Acoustic_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Underwater_Acoustic_PDU::SetAPA
          (Underwater_Acoustic_PDU *this,
          vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_> *A)

{
  KUINT16 *pKVar1;
  long lVar2;
  
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 - ((ushort)((uint)(*(int *)&(this->m_vAPA).
                                                super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                      *(int *)&(this->m_vAPA).
                                               super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 2) &
                      0xfffc);
  std::vector<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>::operator=
            (&this->m_vAPA,A);
  lVar2 = (long)(this->m_vAPA).
                super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_vAPA).
                super__Vector_base<KDIS::DATA_TYPE::APA,_std::allocator<KDIS::DATA_TYPE::APA>_>.
                _M_impl.super__Vector_impl_data._M_start >> 4;
  pKVar1 = &(this->super_Header).super_Header6.m_ui16PDULength;
  *pKVar1 = *pKVar1 + (short)lVar2 * 4;
  this->m_ui8NumAPA = (KUINT8)lVar2;
  return;
}

Assistant:

void Underwater_Acoustic_PDU::SetAPA( const vector<APA> & A )
{
    // Reset PDU length
    m_ui16PDULength -= m_vAPA.size() * APA::APA_SIZE;

    m_vAPA= A;

    // Calculate the new PDU length
    m_ui16PDULength += m_vAPA.size() * APA::APA_SIZE;

    m_ui8NumAPA = m_vAPA.size();
}